

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall rw::World::enumerateLights(World *this,Atomic *atomic,WorldLights *lightData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Light *pLVar4;
  uint32 uVar5;
  int32 iVar6;
  Light *pLVar7;
  Frame *this_00;
  Matrix *pMVar8;
  uint uVar9;
  float32 fVar10;
  V3d VVar11;
  V3d local_88;
  undefined1 local_74 [8];
  V3d dist;
  Sphere *atomsphere;
  Light *l_1;
  LLLink *lnk_1;
  LLLink *_next_1;
  Light *l;
  LLLink *lnk;
  LLLink *_next;
  bool32 normals;
  int32 maxLocals;
  int32 maxDirectionals;
  WorldLights *lightData_local;
  Atomic *atomic_local;
  World *this_local;
  
  iVar1 = lightData->numDirectionals;
  iVar2 = lightData->numLocals;
  lightData->numDirectionals = 0;
  lightData->numLocals = 0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  (lightData->ambient).alpha = 1.0;
  uVar9 = atomic->geometry->flags & 0x10;
  l = (Light *)(this->globalLights).link.next;
  while( true ) {
    pLVar4 = *(Light **)&(l->object).object;
    pLVar7 = (Light *)LinkList::end(&this->globalLights);
    if (l == pLVar7) break;
    pLVar7 = Light::fromWorld((LLLink *)l);
    uVar5 = Light::getFlags(pLVar7);
    l = pLVar4;
    if ((uVar5 & 1) != 0) {
      iVar6 = Light::getType(pLVar7);
      if (iVar6 == 2) {
        (lightData->ambient).red =
             (float32)((float)(pLVar7->color).red + (float)(lightData->ambient).red);
        (lightData->ambient).green =
             (float32)((float)(pLVar7->color).green + (float)(lightData->ambient).green);
        (lightData->ambient).blue =
             (float32)((float)(pLVar7->color).blue + (float)(lightData->ambient).blue);
        lightData->numAmbients = lightData->numAmbients + 1;
      }
      else if (((uVar9 != 0) && (iVar6 = Light::getType(pLVar7), iVar6 == 1)) &&
              (lightData->numDirectionals < iVar1)) {
        iVar3 = lightData->numDirectionals;
        lightData->numDirectionals = iVar3 + 1;
        lightData->directionals[iVar3] = pLVar7;
      }
    }
  }
  if ((atomic->world == this) && (uVar9 != 0)) {
    l_1 = (Light *)(this->localLights).link.next;
    while( true ) {
      pLVar4 = *(Light **)&(l_1->object).object;
      pLVar7 = (Light *)LinkList::end(&this->localLights);
      if ((l_1 == pLVar7) || (iVar2 <= lightData->numLocals)) break;
      pLVar7 = Light::fromWorld((LLLink *)l_1);
      uVar5 = Light::getFlags(pLVar7);
      l_1 = pLVar4;
      if ((uVar5 & 1) != 0) {
        dist._4_8_ = Atomic::getWorldBoundingSphere(atomic);
        this_00 = Light::getFrame(pLVar7);
        pMVar8 = Frame::getLTM(this_00);
        VVar11 = sub(&pMVar8->pos,(V3d *)dist._4_8_);
        local_88._0_8_ = VVar11._0_8_;
        local_74._0_4_ = local_88.x;
        local_74._4_4_ = local_88.y;
        local_88.z = VVar11.z;
        dist.x = local_88.z;
        fVar10 = rw::length((V3d *)local_74);
        if ((float)fVar10 < *(float *)(dist._4_8_ + 0xc) + (float)pLVar7->radius) {
          iVar1 = lightData->numLocals;
          lightData->numLocals = iVar1 + 1;
          lightData->locals[iVar1] = pLVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void
World::enumerateLights(Atomic *atomic, WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	bool32 normals = atomic->geometry->flags & Geometry::NORMALS;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(normals && l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	if(atomic->world != this)
		return;

	if(!normals)
		return;

	// TODO: for this we would use an atomic's world sectors, but we don't have those yet
	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;

		// check if spheres are intersecting
		Sphere *atomsphere = atomic->getWorldBoundingSphere();
		V3d dist = sub(l->getFrame()->getLTM()->pos, atomsphere->center);
		if(length(dist) < atomsphere->radius + l->radius)
			lightData->locals[lightData->numLocals++] = l;
	}
}